

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QAsn1Element>::moveAppend
          (QGenericArrayOps<QAsn1Element> *this,QAsn1Element *b,QAsn1Element *e)

{
  QAsn1Element *pQVar1;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QAsn1Element>).ptr;
    qVar5 = (this->super_QArrayDataPointer<QAsn1Element>).size;
    do {
      pQVar1[qVar5].mType = b->mType;
      pDVar2 = (b->mValue).d.d;
      (b->mValue).d.d = (Data *)0x0;
      pQVar1[qVar5].mValue.d.d = pDVar2;
      pcVar3 = (b->mValue).d.ptr;
      (b->mValue).d.ptr = (char *)0x0;
      pQVar1[qVar5].mValue.d.ptr = pcVar3;
      qVar4 = (b->mValue).d.size;
      (b->mValue).d.size = 0;
      pQVar1[qVar5].mValue.d.size = qVar4;
      b = b + 1;
      qVar5 = (this->super_QArrayDataPointer<QAsn1Element>).size + 1;
      (this->super_QArrayDataPointer<QAsn1Element>).size = qVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }